

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O0

void __thiscall FConsoleBuffer::WriteLineToLog(FConsoleBuffer *this,FILE *LogFile,char *outline)

{
  char cVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  char *local_38;
  char *dstp;
  char *srcp;
  char *copy;
  char *outline_local;
  FILE *LogFile_local;
  FConsoleBuffer *this_local;
  
  sVar2 = strlen(outline);
  __s = (char *)operator_new__(sVar2 + 1);
  local_38 = __s;
  dstp = outline;
  while (*dstp != '\0') {
    if (*dstp == '\x1c') {
      if (dstp[1] == '[') {
        dstp = dstp + 2;
        while( true ) {
          bVar3 = false;
          if (*dstp != ']') {
            bVar3 = *dstp != '\0';
          }
          if (!bVar3) break;
          dstp = dstp + 1;
        }
        if (*dstp == ']') {
          dstp = dstp + 1;
        }
      }
      else {
        if (dstp[1] == '\0') break;
        dstp = dstp + 2;
      }
    }
    else {
      cVar1 = *dstp;
      if (cVar1 == '\x1d') {
        *local_38 = '<';
      }
      else if (cVar1 == '\x1e') {
        *local_38 = '-';
      }
      else if (cVar1 == '\x1f') {
        *local_38 = '>';
      }
      else {
        *local_38 = *dstp;
      }
      local_38 = local_38 + 1;
      dstp = dstp + 1;
    }
  }
  *local_38 = '\0';
  fputs(__s,(FILE *)LogFile);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  fflush((FILE *)LogFile);
  return;
}

Assistant:

void FConsoleBuffer::WriteLineToLog(FILE *LogFile, const char *outline)
{
	// Strip out any color escape sequences before writing to the log file
	char * copy = new char[strlen(outline)+1];
	const char * srcp = outline;
	char * dstp = copy;

	while (*srcp != 0)
	{

		if (*srcp != TEXTCOLOR_ESCAPE)
		{
			switch (*srcp)
			{
				case '\35':
					*dstp++ = '<';
					break;
				
				case '\36':
					*dstp++ = '-';
					break;
				
				case '\37':
					*dstp++ = '>';
					break;
					
				default:
					*dstp++=*srcp;
					break;
			}
			srcp++;
		}
		else if (srcp[1] == '[')
		{
			srcp+=2;
			while (*srcp != ']' && *srcp != 0) srcp++;
			if (*srcp == ']') srcp++;
		}
		else
		{
			if (srcp[1]!=0) srcp+=2;
			else break;
		}
	}
	*dstp=0;

	fputs (copy, LogFile);
	delete [] copy;
	fflush (LogFile);
}